

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void RTMath::convertToVector(uchar *rawData,RTVector3 *vec,RTFLOAT scale,bool bigEndian)

{
  bool bigEndian_local;
  RTFLOAT scale_local;
  RTVector3 *vec_local;
  uchar *rawData_local;
  
  if (bigEndian) {
    RTVector3::setX(vec,(float)(int)CONCAT11(*rawData,rawData[1]) * scale);
    RTVector3::setY(vec,(float)(int)CONCAT11(rawData[2],rawData[3]) * scale);
    RTVector3::setZ(vec,(float)(int)CONCAT11(rawData[4],rawData[5]) * scale);
  }
  else {
    RTVector3::setX(vec,(float)(int)*(short *)rawData * scale);
    RTVector3::setY(vec,(float)(int)*(short *)(rawData + 2) * scale);
    RTVector3::setZ(vec,(float)(int)*(short *)(rawData + 4) * scale);
  }
  return;
}

Assistant:

void RTMath::convertToVector(unsigned char *rawData, RTVector3& vec, RTFLOAT scale, bool bigEndian)
{
    if (bigEndian) {
        vec.setX((RTFLOAT)((int16_t)(((uint16_t)rawData[0] << 8) | (uint16_t)rawData[1])) * scale);
        vec.setY((RTFLOAT)((int16_t)(((uint16_t)rawData[2] << 8) | (uint16_t)rawData[3])) * scale);
        vec.setZ((RTFLOAT)((int16_t)(((uint16_t)rawData[4] << 8) | (uint16_t)rawData[5])) * scale);
    } else {
        vec.setX((RTFLOAT)((int16_t)(((uint16_t)rawData[1] << 8) | (uint16_t)rawData[0])) * scale);
        vec.setY((RTFLOAT)((int16_t)(((uint16_t)rawData[3] << 8) | (uint16_t)rawData[2])) * scale);
        vec.setZ((RTFLOAT)((int16_t)(((uint16_t)rawData[5] << 8) | (uint16_t)rawData[4])) * scale);
     }
}